

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fft.c
# Opt level: O2

int main(int argc,char **argv)

{
  kiss_fft_cfg cfg;
  int s;
  long lVar1;
  double dVar2;
  kiss_fft_cpx audio [22050];
  kiss_fft_cpx fft_out [22050];
  
  for (lVar1 = 0; lVar1 != 0x5622; lVar1 = lVar1 + 1) {
    dVar2 = sin((double)(int)lVar1 * 3.0303030303030302e-05 * 6283.185307179586);
    audio[lVar1].r = (float)(dVar2 * 3535.533905932738);
    audio[lVar1].i = 0.0;
  }
  cfg = kiss_fft_alloc(0xce4,0,(void *)0x0,(size_t *)0x0);
  kiss_fft(cfg,audio,fft_out);
  free(cfg);
  sprintf(mu_message,"FFT result is wrong expected %.2f got %.2f ",0x40a3880000000000,
          (double)fft_out[100].r);
  tests_run = tests_run + 1;
  puts(mu_message);
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
     char *result = all_tests();
     if (result != 0) {
         printf("%s\n", result);
     }
     else {
         printf("ALL TESTS PASSED\n");
     }
     printf("Tests run: %d\n", tests_run);

     return result != 0;
}